

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 669_trimBinaryTree.cpp
# Opt level: O1

int main(void)

{
  TreeNode *root;
  TreeNode *pTVar1;
  TreeNode *unaff_RBX;
  
  root = (TreeNode *)operator_new(0x18);
  root->val = 1;
  root->left = (TreeNode *)0x0;
  root->right = (TreeNode *)0x0;
  pTVar1 = (TreeNode *)operator_new(0x18);
  pTVar1->val = 0;
  pTVar1->left = (TreeNode *)0x0;
  pTVar1->right = (TreeNode *)0x0;
  root->left = pTVar1;
  pTVar1 = (TreeNode *)operator_new(0x18);
  pTVar1->val = 2;
  pTVar1->left = (TreeNode *)0x0;
  pTVar1->right = (TreeNode *)0x0;
  root->right = pTVar1;
  recur(root,1,2);
  printnode(unaff_RBX);
  return 0;
}

Assistant:

int main()
{
    TreeNode* root = new TreeNode(1);
    root->left = new TreeNode(0);
    root->right = new TreeNode(2);
    root = recur(root,1,2);
    printnode(root);
}